

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_fs.c
# Opt level: O0

int picnic_l3_fs_validate_keypair(picnic_l3_fs_privatekey_t *sk,picnic_l3_fs_publickey_t *pk)

{
  int iVar1;
  void *in_RSI;
  long in_RDI;
  uint8_t buffer [32];
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  uint8_t *pk_c;
  uint8_t *pk_pt;
  uint8_t *sk_c;
  uint8_t *sk_pt;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  undefined1 auStackY_100 [16];
  mzd_local_t *in_stack_ffffffffffffff10;
  mzd_local_t *in_stack_ffffffffffffff18;
  lowmc_key_t *in_stack_ffffffffffffff20;
  lowmc_parameters_t *in_stack_ffffffffffffff28;
  mzd_local_t *in_stack_ffffffffffffff30;
  mzd_local_t *in_stack_ffffffffffffff38;
  
  if ((in_RDI != 0) && (in_RSI != (void *)0x0)) {
    picnic_instance_get(Picnic_L3_FS);
    iVar1 = memcmp((void *)(in_RDI + 0x30),(void *)((long)in_RSI + 0x18),0x18);
    if ((iVar1 == 0) && (iVar1 = memcmp((void *)(in_RDI + 0x18),in_RSI,0x18), iVar1 == 0)) {
      mzd_from_char_array(in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
                          (size_t)in_stack_ffffffffffffff28);
      mzd_from_char_array(in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
                          (size_t)in_stack_ffffffffffffff28);
      lowmc_compute(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                    in_stack_ffffffffffffff10);
      mzd_to_char_array((uint8_t *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                        (size_t)in_stack_ffffffffffffff28);
      iVar1 = memcmp(auStackY_100,in_RSI,0x18);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_fs_validate_keypair(const picnic_l3_fs_privatekey_t* sk,
                                                            const picnic_l3_fs_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_pt = SK_PT(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* pk_pt = PK_PT(pk);
  const uint8_t* pk_c  = PK_C(pk);

  // check param and plaintext
  if (memcmp(sk_pt, pk_pt, LOWMC_BLOCK_SZ) != 0 || memcmp(sk_c, pk_c, LOWMC_BLOCK_SZ) != 0) {
    return -1;
  }

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(privkey, sk_sk, LOWMC_BLOCK_SZ);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  uint8_t buffer[MAX_LOWMC_BLOCK_SIZE];
  mzd_to_char_array(buffer, ciphertext, LOWMC_BLOCK_SZ);

  return memcmp(buffer, pk_c, LOWMC_BLOCK_SZ);
}